

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ParseInt64(string_view str,int64_t *out)

{
  string_view str_00;
  bool bVar1;
  long *in_RDX;
  size_t in_RSI;
  long in_FS_OFFSET;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  str_00._M_str = pcVar2;
  str_00._M_len = in_RSI;
  bVar1 = anon_unknown.dwarf_f048e7::ParseIntegral<long>(str_00,in_RDX);
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt64(std::string_view str, int64_t* out)
{
    return ParseIntegral<int64_t>(str, out);
}